

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::visit<Imath_2_5::Vec2<short>>
               (int *level,int n,int k,vector<int,_std::allocator<int>_> *value,
               vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *perms)

{
  reference pvVar1;
  vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  int i;
  int iVar2;
  int iVar3;
  
  *in_RDI = *in_RDI + 1;
  iVar2 = *in_RDI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)in_RCX,(long)in_EDX);
  *pvVar1 = iVar2;
  if (*in_RDI == in_ESI) {
    addItem<Imath_2_5::Vec2<short>>
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),in_RCX);
  }
  else {
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_RCX,(long)iVar3);
      if (*pvVar1 == 0) {
        visit<Imath_2_5::Vec2<short>>
                  ((int *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,
                   (vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *)
                   CONCAT44(iVar3,iVar2));
      }
    }
  }
  *in_RDI = *in_RDI + -1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)in_RCX,(long)in_EDX);
  *pvVar1 = 0;
  return;
}

Assistant:

static void
visit(int &level, int n, int k, std::vector<int> &value, std::vector<T> &perms)
{
    level = level + 1;
    value[k] = level;

    if (level == n)
        addItem(value, perms);
    else
        for (int i = 0; i < n; i++)
            if (value[i] == 0)
                visit(level, n, i, value, perms);

    level = level - 1;
    value[k] = 0;
}